

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl.cxx
# Opt level: O0

int send_event(int event,Fl_Widget *to,Fl_Window *window)

{
  int iVar1;
  int iVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  int ret;
  int save_y;
  int save_x;
  Fl_Widget *w;
  int local_28;
  int old_event;
  int dy;
  int dx;
  Fl_Window *window_local;
  Fl_Widget *to_local;
  int event_local;
  
  iVar1 = Fl::e_number;
  _save_y = (Fl_Group *)to;
  if (window == (Fl_Window *)0x0) {
    local_28 = 0;
    old_event = 0;
  }
  else {
    old_event = Fl_Widget::x((Fl_Widget *)window);
    local_28 = Fl_Widget::y((Fl_Widget *)window);
  }
  for (; iVar2 = Fl::e_y, iVar4 = Fl::e_x, _save_y != (Fl_Group *)0x0;
      _save_y = Fl_Widget::parent(&_save_y->super_Fl_Widget)) {
    bVar3 = Fl_Widget::type(&_save_y->super_Fl_Widget);
    if (0xef < bVar3) {
      iVar4 = Fl_Widget::x(&_save_y->super_Fl_Widget);
      old_event = old_event - iVar4;
      iVar4 = Fl_Widget::y(&_save_y->super_Fl_Widget);
      local_28 = local_28 - iVar4;
    }
  }
  Fl::e_x = old_event + Fl::e_x;
  Fl::e_y = local_28 + Fl::e_y;
  Fl::e_number = event;
  iVar5 = (*to->_vptr_Fl_Widget[3])();
  Fl::e_number = iVar1;
  Fl::e_y = iVar2;
  Fl::e_x = iVar4;
  return iVar5;
}

Assistant:

static int send_event(int event, Fl_Widget* to, Fl_Window* window) {
  int dx, dy;
  int old_event = Fl::e_number;
  if (window) {
    dx = window->x();
    dy = window->y();
  } else {
    dx = dy = 0;
  }
  for (const Fl_Widget* w = to; w; w = w->parent())
    if (w->type()>=FL_WINDOW) {dx -= w->x(); dy -= w->y();}
  int save_x = Fl::e_x; Fl::e_x += dx;
  int save_y = Fl::e_y; Fl::e_y += dy;
  int ret = to->handle(Fl::e_number = event);
  Fl::e_number = old_event;
  Fl::e_y = save_y;
  Fl::e_x = save_x;
  return ret;
}